

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

Error * ot::commissioner::CommissionerImpl::DecodeChannelMask
                  (Error *__return_storage_ptr__,ChannelMask *aChannelMask,ByteArray *aBuf)

{
  ulong uVar1;
  char cVar2;
  pointer puVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  ulong uVar7;
  ulong uVar8;
  format_args args;
  format_args args_00;
  writer write;
  format_string_checker<char> local_f8;
  string *local_c8;
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  *local_c0;
  string local_b8;
  ChannelMaskEntry entry;
  ChannelMask channelMask;
  undefined1 local_58 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  local_c8 = &__return_storage_ptr__->mMessage;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  channelMask.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  channelMask.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  channelMask.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar8 = (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar7 = 0;
  local_c0 = aChannelMask;
  do {
    if (uVar8 <= uVar7) {
      if (uVar7 != uVar8) {
        __assert_fail("condition",
                      "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp"
                      ,0x6b9,
                      "static Error ot::commissioner::CommissionerImpl::DecodeChannelMask(ChannelMask &, const ByteArray &)"
                     );
      }
      std::
      vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ::operator=(local_c0,&channelMask);
LAB_001575ca:
      std::
      vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ::~vector(&channelMask);
      return __return_storage_ptr__;
    }
    entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar1 = uVar7 + 2;
    if (uVar8 < uVar1) {
      local_f8.types_[0] = none_type;
      local_f8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "premature end of Channel Mask Entry";
      local_f8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x23;
      local_f8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_f8.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_f8.parse_funcs_[0] = (parse_func)0x0;
      pcVar5 = "premature end of Channel Mask Entry";
      write.handler_ = &local_f8;
      local_f8.context_.types_ = local_f8.types_;
      while (pcVar5 != "") {
        cVar2 = *pcVar5;
        pcVar6 = pcVar5;
        while (cVar2 != '{') {
          pcVar6 = pcVar6 + 1;
          if (pcVar6 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&write,pcVar5,"");
            goto LAB_00157516;
          }
          cVar2 = *pcVar6;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&write,pcVar5,pcVar6);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",&local_f8);
      }
LAB_00157516:
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)&local_f8;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_b8,(v10 *)"premature end of Channel Mask Entry",(string_view)ZEXT816(0x23),
                 args);
      local_58._0_4_ = kBadFormat;
      std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_b8);
LAB_0015759a:
      Error::operator=(__return_storage_ptr__,(Error *)local_58);
      std::__cxx11::string::~string((string *)(local_58 + 8));
      std::__cxx11::string::~string((string *)&local_b8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      goto LAB_001575ca;
    }
    puVar3 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    entry.mPage = puVar3[uVar7];
    lVar4 = uVar7 + 1;
    uVar7 = uVar1 + puVar3[lVar4];
    if (uVar8 < uVar7) {
      local_f8.types_[0] = none_type;
      local_f8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "premature end of Channel Mask Entry";
      local_f8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x23;
      local_f8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_f8.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_f8.parse_funcs_[0] = (parse_func)0x0;
      pcVar5 = "premature end of Channel Mask Entry";
      write.handler_ = &local_f8;
      local_f8.context_.types_ = local_f8.types_;
      while (pcVar5 != "") {
        cVar2 = *pcVar5;
        pcVar6 = pcVar5;
        while (cVar2 != '{') {
          pcVar6 = pcVar6 + 1;
          if (pcVar6 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&write,pcVar5,"");
            goto LAB_00157563;
          }
          cVar2 = *pcVar6;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&write,pcVar5,pcVar6);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",&local_f8);
      }
LAB_00157563:
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_f8;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_b8,(v10 *)"premature end of Channel Mask Entry",(string_view)ZEXT816(0x23),
                 args_00);
      local_58._0_4_ = kBadFormat;
      std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_b8);
      goto LAB_0015759a;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_f8,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(puVar3 + uVar1),
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(puVar3 + uVar1 + puVar3[lVar4]),(allocator_type *)local_58);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&entry.mMasks,&local_f8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8);
    std::
    vector<ot::commissioner::ChannelMaskEntry,std::allocator<ot::commissioner::ChannelMaskEntry>>::
    emplace_back<ot::commissioner::ChannelMaskEntry&>
              ((vector<ot::commissioner::ChannelMaskEntry,std::allocator<ot::commissioner::ChannelMaskEntry>>
                *)&channelMask,&entry);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  } while( true );
}

Assistant:

Error CommissionerImpl::DecodeChannelMask(ChannelMask &aChannelMask, const ByteArray &aBuf)
{
    Error       error;
    ChannelMask channelMask;
    size_t      offset = 0;
    size_t      length = aBuf.size();

    while (offset < length)
    {
        ChannelMaskEntry entry;
        uint8_t          entryLength;
        VerifyOrExit(offset + 2 <= length, error = ERROR_BAD_FORMAT("premature end of Channel Mask Entry"));

        entry.mPage = aBuf[offset++];
        entryLength = aBuf[offset++];

        VerifyOrExit(offset + entryLength <= length, error = ERROR_BAD_FORMAT("premature end of Channel Mask Entry"));
        entry.mMasks = {aBuf.begin() + offset, aBuf.begin() + offset + entryLength};
        channelMask.emplace_back(entry);

        offset += entryLength;
    }

    ASSERT(offset == length);

    aChannelMask = channelMask;

exit:
    return error;
}